

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O0

bool __thiscall Name_Num::operator<(Name_Num *this,Name_Num *other)

{
  char *__first1;
  char *pcVar1;
  char *__first2;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  bool local_19;
  Name_Num *other_local;
  Name_Num *this_local;
  
  __first1 = this->name;
  pcVar1 = this->name;
  sVar4 = strlen(this->name);
  __first2 = other->name;
  pcVar2 = other->name;
  sVar5 = strlen(other->name);
  bVar3 = std::lexicographical_compare<char_const*,char_const*>
                    (__first1,pcVar1 + sVar4,__first2,pcVar2 + sVar5);
  local_19 = true;
  if (!bVar3) {
    local_19 = this->number < other->number;
  }
  return local_19;
}

Assistant:

bool operator<(const Name_Num &other) const
  {
    return std::lexicographical_compare(name, name + strlen(name), other.name,
                                        other.name + strlen(other.name)) ||
           (number < other.number);
  }